

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

token * get_next_token(token *__return_storage_ptr__,iit *iter,iit *end)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  reference pcVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var5;
  undefined1 local_58 [8];
  token retval;
  iit *end_local;
  iit *iter_local;
  
  retval.lexeme.field_2._8_8_ = end;
  token::token((token *)local_58,tokNil);
  bVar2 = skip_space(iter,(iit *)retval.lexeme.field_2._8_8_);
  if (bVar2) {
    retval._0_8_ = iter->_M_current;
    std::__cxx11::string::operator=((string *)&retval.end_iter,"");
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(iter);
    cVar1 = *pcVar4;
    if (cVar1 == '(') {
      local_58._0_4_ = tokOpenParen;
    }
    else if (cVar1 == ')') {
      local_58._0_4_ = tokCloseParen;
    }
    else if (cVar1 == ';') {
      local_58._0_4_ = tokSemi;
    }
    if (local_58._0_4_ == tokNil) {
      while (bVar2 = __gnu_cxx::operator!=
                               (iter,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)retval.lexeme.field_2._8_8_), bVar2) {
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(iter);
        iVar3 = isalnum((int)*pcVar4);
        if (iVar3 == 0) {
          pcVar4 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(iter);
          if (*pcVar4 != '_') break;
          std::__cxx11::string::operator+=((string *)&retval.end_iter,'_');
        }
        else {
          pcVar4 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(iter);
          std::__cxx11::string::operator+=((string *)&retval.end_iter,*pcVar4);
        }
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(iter);
      }
      bVar2 = __gnu_cxx::operator==
                        (iter,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&retval);
      if (bVar2) {
        token::mkend(__return_storage_ptr__,
                     (input_iterator_type)*(char **)retval.lexeme.field_2._8_8_);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&retval.end_iter,"var");
        if (bVar2) {
          local_58._0_4_ = tokVar;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&retval.end_iter,"func");
          if (bVar2) {
            local_58._0_4_ = tokFunc;
          }
          else {
            local_58._0_4_ = tokIdent;
          }
        }
        retval.start_iter._M_current = iter->_M_current;
        token::token(__return_storage_ptr__,(token *)local_58);
      }
    }
    else {
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(iter);
      std::__cxx11::string::operator=((string *)&retval.end_iter,*pcVar4);
      p_Var5 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++(iter);
      retval.start_iter._M_current = p_Var5->_M_current;
      token::token(__return_storage_ptr__,(token *)local_58);
    }
  }
  else {
    token::mkend(__return_storage_ptr__,(input_iterator_type)*(char **)retval.lexeme.field_2._8_8_);
  }
  token::~token((token *)local_58);
  return __return_storage_ptr__;
}

Assistant:

token get_next_token(iit &iter, iit &end) {
    token retval;
    
    if (! skip_space(iter, end)) {
        return token::mkend(end);
    }
    
    // skip_space guarantees we are not at the end of 
    // input but are at a non-space character.
    
    retval.start_iter = iter;
    retval.lexeme = "";
    
    // check punctuation first
    switch (*iter) {
        case ';' : retval.toktype = tokSemi; break;
        case '(' : retval.toktype = tokOpenParen; break;
        case ')' : retval.toktype = tokCloseParen; break;
    };
    
    if (retval.toktype != tokNil) {
        retval.lexeme = *iter;
        retval.end_iter = ++iter;
        return retval;
    }
    
    while (iter != end) {
        if (std::isalnum(*iter))
            retval.lexeme += *iter;
        else if (*iter == '_')
            retval.lexeme += '_';
        else
            break;
        
        ++iter;
    }
    
    if (iter == retval.start_iter) {
        // we didn't consume any input. (Except maybe spaces).
        // So just signal the end. Otherwise any outer loop
        // will spin forever.
        return token::mkend(end);
    }
    
    if (retval.lexeme == "var" )
        retval.toktype = tokVar;
    else if (retval.lexeme == "func" )
        retval.toktype = tokFunc;
    else
        retval.toktype = tokIdent;
        
    retval.end_iter = iter;

    
    return retval;
}